

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glew.c
# Opt level: O1

GLenum glxewInit(void)

{
  ulong uVar1;
  int iVar2;
  Display *pDVar3;
  GLboolean *pGVar4;
  GLubyte *pGVar5;
  PFNGLXCREATENEWCONTEXTPROC p_Var6;
  PFNGLXCREATEPBUFFERPROC p_Var7;
  PFNGLXCREATEPIXMAPPROC p_Var8;
  PFNGLXCREATEWINDOWPROC p_Var9;
  PFNGLXDESTROYPBUFFERPROC p_Var10;
  PFNGLXDESTROYPIXMAPPROC p_Var11;
  PFNGLXDESTROYWINDOWPROC p_Var12;
  PFNGLXGETCURRENTREADDRAWABLEPROC p_Var13;
  PFNGLXGETFBCONFIGATTRIBPROC p_Var14;
  PFNGLXGETFBCONFIGSPROC p_Var15;
  PFNGLXGETSELECTEDEVENTPROC p_Var16;
  PFNGLXGETVISUALFROMFBCONFIGPROC p_Var17;
  PFNGLXMAKECONTEXTCURRENTPROC p_Var18;
  PFNGLXQUERYCONTEXTPROC p_Var19;
  PFNGLXQUERYDRAWABLEPROC p_Var20;
  PFNGLXCREATEASSOCIATEDCONTEXTAMDPROC p_Var21;
  PFNGLXCREATEASSOCIATEDCONTEXTATTRIBSAMDPROC p_Var22;
  PFNGLXDELETEASSOCIATEDCONTEXTAMDPROC p_Var23;
  PFNGLXGETCONTEXTGPUIDAMDPROC p_Var24;
  PFNGLXGETCURRENTASSOCIATEDCONTEXTAMDPROC p_Var25;
  PFNGLXGETGPUIDSAMDPROC p_Var26;
  PFNGLXGETGPUINFOAMDPROC p_Var27;
  PFNGLXFREECONTEXTEXTPROC p_Var28;
  PFNGLXGETCONTEXTIDEXTPROC p_Var29;
  PFNGLXIMPORTCONTEXTEXTPROC p_Var30;
  PFNGLXQUERYCURRENTRENDERERINTEGERMESAPROC p_Var31;
  PFNGLXQUERYCURRENTRENDERERSTRINGMESAPROC p_Var32;
  PFNGLXQUERYRENDERERINTEGERMESAPROC p_Var33;
  PFNGLXQUERYFRAMECOUNTNVPROC p_Var34;
  PFNGLXQUERYMAXSWAPGROUPSNVPROC p_Var35;
  PFNGLXQUERYSWAPGROUPNVPROC p_Var36;
  PFNGLXENUMERATEVIDEOCAPTUREDEVICESNVPROC p_Var37;
  PFNGLXLOCKVIDEOCAPTUREDEVICENVPROC p_Var38;
  PFNGLXQUERYVIDEOCAPTUREDEVICENVPROC p_Var39;
  PFNGLXGETVIDEOINFONVPROC p_Var40;
  PFNGLXRELEASEVIDEODEVICENVPROC p_Var41;
  PFNGLXRELEASEVIDEOIMAGENVPROC p_Var42;
  PFNGLXGETSYNCVALUESOMLPROC p_Var43;
  PFNGLXSWAPBUFFERSMSCOMLPROC p_Var44;
  PFNGLXWAITFORMSCOMLPROC p_Var45;
  PFNGLXCREATEGLXPIXMAPWITHCONFIGSGIXPROC p_Var46;
  PFNGLXGETFBCONFIGATTRIBSGIXPROC p_Var47;
  PFNGLXGETFBCONFIGFROMVISUALSGIXPROC p_Var48;
  PFNGLXBINDHYPERPIPESGIXPROC p_Var49;
  PFNGLXDESTROYHYPERPIPECONFIGSGIXPROC p_Var50;
  PFNGLXHYPERPIPEATTRIBSGIXPROC p_Var51;
  PFNGLXHYPERPIPECONFIGSGIXPROC p_Var52;
  PFNGLXQUERYHYPERPIPEATTRIBSGIXPROC p_Var53;
  PFNGLXQUERYHYPERPIPEBESTATTRIBSGIXPROC p_Var54;
  PFNGLXQUERYHYPERPIPECONFIGSGIXPROC p_Var55;
  PFNGLXDESTROYGLXPBUFFERSGIXPROC p_Var56;
  PFNGLXGETSELECTEDEVENTSGIXPROC p_Var57;
  PFNGLXQUERYGLXPBUFFERSGIXPROC p_Var58;
  PFNGLXCHANNELRECTSGIXPROC p_Var59;
  PFNGLXCHANNELRECTSYNCSGIXPROC p_Var60;
  PFNGLXQUERYCHANNELDELTASSGIXPROC p_Var61;
  GLenum GVar62;
  GLubyte *start;
  GLuint i;
  ulong uVar63;
  bool bVar64;
  bool bVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  int minor;
  int major;
  int local_88;
  int local_68;
  int local_58;
  int local_48;
  int local_38;
  int local_34;
  
  __glewXGetCurrentDisplay =
       (PFNGLXGETCURRENTDISPLAYPROC)glXGetProcAddressARB("glXGetCurrentDisplay");
  GVar62 = 3;
  if (__glewXGetCurrentDisplay != (PFNGLXGETCURRENTDISPLAYPROC)0x0) {
    pDVar3 = (*__glewXGetCurrentDisplay)();
    if (pDVar3 == (Display *)0x0) {
      GVar62 = 4;
    }
    else {
      __GLXEW_VERSION_1_0 = '\x01';
      __GLXEW_VERSION_1_1 = '\x01';
      __GLXEW_VERSION_1_2 = '\x01';
      __GLXEW_VERSION_1_3 = '\x01';
      __GLXEW_VERSION_1_4 = '\x01';
      glXQueryVersion(pDVar3,&local_34,&local_38);
      if (local_38 < 4 && local_34 == 1) {
        if (local_38 == 3) {
          pGVar4 = &__GLXEW_VERSION_1_4;
        }
        else {
          if (local_38 != 2) {
            return 3;
          }
          __GLXEW_VERSION_1_4 = '\0';
          pGVar4 = &__GLXEW_VERSION_1_3;
        }
        *pGVar4 = '\0';
      }
      if (__glewXGetCurrentDisplay == (PFNGLXGETCURRENTDISPLAYPROC)0x0) {
        pGVar5 = (GLubyte *)0x0;
      }
      else {
        pGVar5 = (GLubyte *)glXGetClientString(pDVar3,3);
      }
      start = "";
      uVar1 = 0;
      if (pGVar5 != (GLubyte *)0x0) {
        start = pGVar5;
      }
      do {
        uVar63 = uVar1;
        uVar1 = (ulong)((int)uVar63 + 1);
      } while (start[uVar63] != '\0');
      pGVar5 = start + uVar63;
      if (__GLXEW_VERSION_1_3 != '\0' || glewExperimental != '\0') {
        __glewXChooseFBConfig = (PFNGLXCHOOSEFBCONFIGPROC)glXGetProcAddressARB("glXChooseFBConfig");
        bVar64 = __glewXChooseFBConfig != (PFNGLXCHOOSEFBCONFIGPROC)0x0;
        p_Var6 = (PFNGLXCREATENEWCONTEXTPROC)glXGetProcAddressARB("glXCreateNewContext");
        __glewXCreateNewContext = p_Var6;
        p_Var7 = (PFNGLXCREATEPBUFFERPROC)glXGetProcAddressARB("glXCreatePbuffer");
        __glewXCreatePbuffer = p_Var7;
        p_Var8 = (PFNGLXCREATEPIXMAPPROC)glXGetProcAddressARB("glXCreatePixmap");
        __glewXCreatePixmap = p_Var8;
        p_Var9 = (PFNGLXCREATEWINDOWPROC)glXGetProcAddressARB("glXCreateWindow");
        __glewXCreateWindow = p_Var9;
        p_Var10 = (PFNGLXDESTROYPBUFFERPROC)glXGetProcAddressARB("glXDestroyPbuffer");
        __glewXDestroyPbuffer = p_Var10;
        p_Var11 = (PFNGLXDESTROYPIXMAPPROC)glXGetProcAddressARB("glXDestroyPixmap");
        __glewXDestroyPixmap = p_Var11;
        p_Var12 = (PFNGLXDESTROYWINDOWPROC)glXGetProcAddressARB("glXDestroyWindow");
        __glewXDestroyWindow = p_Var12;
        p_Var13 = (PFNGLXGETCURRENTREADDRAWABLEPROC)
                  glXGetProcAddressARB("glXGetCurrentReadDrawable");
        __glewXGetCurrentReadDrawable = p_Var13;
        p_Var14 = (PFNGLXGETFBCONFIGATTRIBPROC)glXGetProcAddressARB("glXGetFBConfigAttrib");
        __glewXGetFBConfigAttrib = p_Var14;
        p_Var15 = (PFNGLXGETFBCONFIGSPROC)glXGetProcAddressARB("glXGetFBConfigs");
        __glewXGetFBConfigs = p_Var15;
        p_Var16 = (PFNGLXGETSELECTEDEVENTPROC)glXGetProcAddressARB("glXGetSelectedEvent");
        __glewXGetSelectedEvent = p_Var16;
        p_Var17 = (PFNGLXGETVISUALFROMFBCONFIGPROC)glXGetProcAddressARB("glXGetVisualFromFBConfig");
        __glewXGetVisualFromFBConfig = p_Var17;
        p_Var18 = (PFNGLXMAKECONTEXTCURRENTPROC)glXGetProcAddressARB("glXMakeContextCurrent");
        __glewXMakeContextCurrent = p_Var18;
        p_Var19 = (PFNGLXQUERYCONTEXTPROC)glXGetProcAddressARB("glXQueryContext");
        __glewXQueryContext = p_Var19;
        p_Var20 = (PFNGLXQUERYDRAWABLEPROC)glXGetProcAddressARB("glXQueryDrawable");
        __glewXQueryDrawable = p_Var20;
        __glewXSelectEvent = (PFNGLXSELECTEVENTPROC)glXGetProcAddressARB("glXSelectEvent");
        local_68 = (int)p_Var14;
        local_58 = (int)p_Var12;
        local_48 = (int)p_Var10;
        auVar101._0_4_ = -(uint)((int)p_Var7 == 0);
        auVar101._4_4_ = -(uint)((int)((ulong)p_Var7 >> 0x20) == 0);
        auVar101._8_4_ = -(uint)((int)p_Var6 == 0);
        auVar101._12_4_ = -(uint)((int)((ulong)p_Var6 >> 0x20) == 0);
        auVar104._4_4_ = auVar101._0_4_;
        auVar104._0_4_ = auVar101._4_4_;
        auVar104._8_4_ = auVar101._12_4_;
        auVar104._12_4_ = auVar101._8_4_;
        auVar106._0_4_ = -(uint)((int)p_Var9 == 0);
        auVar106._4_4_ = -(uint)((int)((ulong)p_Var9 >> 0x20) == 0);
        auVar106._8_4_ = -(uint)((int)p_Var8 == 0);
        auVar106._12_4_ = -(uint)((int)((ulong)p_Var8 >> 0x20) == 0);
        auVar102._4_4_ = auVar106._0_4_;
        auVar102._0_4_ = auVar106._4_4_;
        auVar102._8_4_ = auVar106._12_4_;
        auVar102._12_4_ = auVar106._8_4_;
        auVar103 = packssdw(auVar102 & auVar106,auVar104 & auVar101);
        auVar97._0_4_ = -(uint)((int)p_Var11 == 0);
        auVar97._4_4_ = -(uint)((int)((ulong)p_Var11 >> 0x20) == 0);
        auVar97._8_4_ = -(uint)(local_48 == 0);
        auVar97._12_4_ = -(uint)((int)((ulong)p_Var10 >> 0x20) == 0);
        auVar105._4_4_ = auVar97._0_4_;
        auVar105._0_4_ = auVar97._4_4_;
        auVar105._8_4_ = auVar97._12_4_;
        auVar105._12_4_ = auVar97._8_4_;
        auVar100._0_4_ = -(uint)((int)p_Var13 == 0);
        auVar100._4_4_ = -(uint)((int)((ulong)p_Var13 >> 0x20) == 0);
        auVar100._8_4_ = -(uint)(local_58 == 0);
        auVar100._12_4_ = -(uint)((int)((ulong)p_Var12 >> 0x20) == 0);
        auVar98._4_4_ = auVar100._0_4_;
        auVar98._0_4_ = auVar100._4_4_;
        auVar98._8_4_ = auVar100._12_4_;
        auVar98._12_4_ = auVar100._8_4_;
        auVar99 = packssdw(auVar98 & auVar100,auVar105 & auVar97);
        auVar100 = packssdw(auVar99,auVar103);
        auVar83._0_4_ = -(uint)((int)p_Var15 == 0);
        auVar83._4_4_ = -(uint)((int)((ulong)p_Var15 >> 0x20) == 0);
        auVar83._8_4_ = -(uint)(local_68 == 0);
        auVar83._12_4_ = -(uint)((int)((ulong)p_Var14 >> 0x20) == 0);
        auVar94._4_4_ = auVar83._0_4_;
        auVar94._0_4_ = auVar83._4_4_;
        auVar94._8_4_ = auVar83._12_4_;
        auVar94._12_4_ = auVar83._8_4_;
        auVar85._0_4_ = -(uint)((int)p_Var17 == 0);
        auVar85._4_4_ = -(uint)((int)((ulong)p_Var17 >> 0x20) == 0);
        auVar85._8_4_ = -(uint)((int)p_Var16 == 0);
        auVar85._12_4_ = -(uint)((int)((ulong)p_Var16 >> 0x20) == 0);
        auVar84._4_4_ = auVar85._0_4_;
        auVar84._0_4_ = auVar85._4_4_;
        auVar84._8_4_ = auVar85._12_4_;
        auVar84._12_4_ = auVar85._8_4_;
        auVar85 = packssdw(auVar84 & auVar85,auVar94 & auVar83);
        auVar103._0_4_ = -(uint)((int)p_Var19 == 0);
        auVar103._4_4_ = -(uint)((int)((ulong)p_Var19 >> 0x20) == 0);
        auVar103._8_4_ = -(uint)((int)p_Var18 == 0);
        auVar103._12_4_ = -(uint)((int)((ulong)p_Var18 >> 0x20) == 0);
        auVar80._4_4_ = auVar103._0_4_;
        auVar80._0_4_ = auVar103._4_4_;
        auVar80._8_4_ = auVar103._12_4_;
        auVar80._12_4_ = auVar103._8_4_;
        auVar99._0_4_ = -(uint)((int)__glewXSelectEvent == 0);
        auVar99._4_4_ = -(uint)((int)((ulong)__glewXSelectEvent >> 0x20) == 0);
        auVar99._8_4_ = -(uint)((int)p_Var20 == 0);
        auVar99._12_4_ = -(uint)((int)((ulong)p_Var20 >> 0x20) == 0);
        auVar68._4_4_ = auVar99._0_4_;
        auVar68._0_4_ = auVar99._4_4_;
        auVar68._8_4_ = auVar99._12_4_;
        auVar68._12_4_ = auVar99._8_4_;
        auVar99 = packssdw(auVar68 & auVar99,auVar80 & auVar103);
        auVar99 = packssdw(auVar99,auVar85);
        auVar99 = packsswb(auVar99,auVar100);
        __GLXEW_VERSION_1_3 =
             ((((((((((((((((auVar99 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar99 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar99 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar99 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar99 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar99 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar99 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar99 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar99 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar99 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar99 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar99 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar99 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar99 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar99 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             -1 < auVar99[0xf]) && bVar64;
      }
      __GLXEW_3DFX_multisample = _glewSearchExtension("GLX_3DFX_multisample",start,pGVar5);
      __GLXEW_AMD_gpu_association = _glewSearchExtension("GLX_AMD_gpu_association",start,pGVar5);
      if (__GLXEW_AMD_gpu_association != '\0' || glewExperimental != '\0') {
        __glewXBlitContextFramebufferAMD =
             (PFNGLXBLITCONTEXTFRAMEBUFFERAMDPROC)
             glXGetProcAddressARB("glXBlitContextFramebufferAMD");
        bVar64 = __glewXBlitContextFramebufferAMD != (PFNGLXBLITCONTEXTFRAMEBUFFERAMDPROC)0x0;
        p_Var21 = (PFNGLXCREATEASSOCIATEDCONTEXTAMDPROC)
                  glXGetProcAddressARB("glXCreateAssociatedContextAMD");
        __glewXCreateAssociatedContextAMD = p_Var21;
        p_Var22 = (PFNGLXCREATEASSOCIATEDCONTEXTATTRIBSAMDPROC)
                  glXGetProcAddressARB("glXCreateAssociatedContextAttribsAMD");
        __glewXCreateAssociatedContextAttribsAMD = p_Var22;
        p_Var23 = (PFNGLXDELETEASSOCIATEDCONTEXTAMDPROC)
                  glXGetProcAddressARB("glXDeleteAssociatedContextAMD");
        __glewXDeleteAssociatedContextAMD = p_Var23;
        p_Var24 = (PFNGLXGETCONTEXTGPUIDAMDPROC)glXGetProcAddressARB("glXGetContextGPUIDAMD");
        __glewXGetContextGPUIDAMD = p_Var24;
        p_Var25 = (PFNGLXGETCURRENTASSOCIATEDCONTEXTAMDPROC)
                  glXGetProcAddressARB("glXGetCurrentAssociatedContextAMD");
        __glewXGetCurrentAssociatedContextAMD = p_Var25;
        p_Var26 = (PFNGLXGETGPUIDSAMDPROC)glXGetProcAddressARB("glXGetGPUIDsAMD");
        __glewXGetGPUIDsAMD = p_Var26;
        p_Var27 = (PFNGLXGETGPUINFOAMDPROC)glXGetProcAddressARB("glXGetGPUInfoAMD");
        __glewXGetGPUInfoAMD = p_Var27;
        __glewXMakeAssociatedContextCurrentAMD =
             (PFNGLXMAKEASSOCIATEDCONTEXTCURRENTAMDPROC)
             glXGetProcAddressARB("glXMakeAssociatedContextCurrentAMD");
        local_88 = (int)p_Var21;
        auVar90._0_4_ = -(uint)((int)p_Var22 == 0);
        auVar90._4_4_ = -(uint)((int)((ulong)p_Var22 >> 0x20) == 0);
        auVar90._8_4_ = -(uint)(local_88 == 0);
        auVar90._12_4_ = -(uint)((int)((ulong)p_Var21 >> 0x20) == 0);
        auVar95._4_4_ = auVar90._0_4_;
        auVar95._0_4_ = auVar90._4_4_;
        auVar95._8_4_ = auVar90._12_4_;
        auVar95._12_4_ = auVar90._8_4_;
        auVar86._0_4_ = -(uint)((int)p_Var24 == 0);
        auVar86._4_4_ = -(uint)((int)((ulong)p_Var24 >> 0x20) == 0);
        auVar86._8_4_ = -(uint)((int)p_Var23 == 0);
        auVar86._12_4_ = -(uint)((int)((ulong)p_Var23 >> 0x20) == 0);
        auVar91._4_4_ = auVar86._0_4_;
        auVar91._0_4_ = auVar86._4_4_;
        auVar91._8_4_ = auVar86._12_4_;
        auVar91._12_4_ = auVar86._8_4_;
        auVar103 = packssdw(auVar91 & auVar86,auVar95 & auVar90);
        auVar81._0_4_ = -(uint)((int)p_Var26 == 0);
        auVar81._4_4_ = -(uint)((int)((ulong)p_Var26 >> 0x20) == 0);
        auVar81._8_4_ = -(uint)((int)p_Var25 == 0);
        auVar81._12_4_ = -(uint)((int)((ulong)p_Var25 >> 0x20) == 0);
        auVar87._4_4_ = auVar81._0_4_;
        auVar87._0_4_ = auVar81._4_4_;
        auVar87._8_4_ = auVar81._12_4_;
        auVar87._12_4_ = auVar81._8_4_;
        auVar66._0_4_ = -(uint)((int)__glewXMakeAssociatedContextCurrentAMD == 0);
        auVar66._4_4_ = -(uint)((int)((ulong)__glewXMakeAssociatedContextCurrentAMD >> 0x20) == 0);
        auVar66._8_4_ = -(uint)((int)p_Var27 == 0);
        auVar66._12_4_ = -(uint)((int)((ulong)p_Var27 >> 0x20) == 0);
        auVar69._4_4_ = auVar66._0_4_;
        auVar69._0_4_ = auVar66._4_4_;
        auVar69._8_4_ = auVar66._12_4_;
        auVar69._12_4_ = auVar66._8_4_;
        auVar99 = packssdw(auVar69 & auVar66,auVar87 & auVar81);
        auVar99 = packssdw(auVar99,auVar103);
        __GLXEW_AMD_gpu_association =
             ((((((((auVar99 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar99 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar99 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar99 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar99 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar99 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar99 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             -1 < auVar99[0xf]) && bVar64;
      }
      __GLXEW_ARB_context_flush_control =
           _glewSearchExtension("GLX_ARB_context_flush_control",start,pGVar5);
      __GLXEW_ARB_create_context = _glewSearchExtension("GLX_ARB_create_context",start,pGVar5);
      if (__GLXEW_ARB_create_context != '\0' || glewExperimental != '\0') {
        __glewXCreateContextAttribsARB =
             (PFNGLXCREATECONTEXTATTRIBSARBPROC)glXGetProcAddressARB("glXCreateContextAttribsARB");
        __GLXEW_ARB_create_context =
             __glewXCreateContextAttribsARB != (PFNGLXCREATECONTEXTATTRIBSARBPROC)0x0;
      }
      __GLXEW_ARB_create_context_no_error =
           _glewSearchExtension("GLX_ARB_create_context_no_error",start,pGVar5);
      __GLXEW_ARB_create_context_profile =
           _glewSearchExtension("GLX_ARB_create_context_profile",start,pGVar5);
      __GLXEW_ARB_create_context_robustness =
           _glewSearchExtension("GLX_ARB_create_context_robustness",start,pGVar5);
      __GLXEW_ARB_fbconfig_float = _glewSearchExtension("GLX_ARB_fbconfig_float",start,pGVar5);
      __GLXEW_ARB_framebuffer_sRGB = _glewSearchExtension("GLX_ARB_framebuffer_sRGB",start,pGVar5);
      __GLXEW_ARB_get_proc_address = _glewSearchExtension("GLX_ARB_get_proc_address",start,pGVar5);
      __GLXEW_ARB_multisample = _glewSearchExtension("GLX_ARB_multisample",start,pGVar5);
      __GLXEW_ARB_robustness_application_isolation =
           _glewSearchExtension("GLX_ARB_robustness_application_isolation",start,pGVar5);
      __GLXEW_ARB_robustness_share_group_isolation =
           _glewSearchExtension("GLX_ARB_robustness_share_group_isolation",start,pGVar5);
      __GLXEW_ARB_vertex_buffer_object =
           _glewSearchExtension("GLX_ARB_vertex_buffer_object",start,pGVar5);
      __GLXEW_ATI_pixel_format_float =
           _glewSearchExtension("GLX_ATI_pixel_format_float",start,pGVar5);
      __GLXEW_ATI_render_texture = _glewSearchExtension("GLX_ATI_render_texture",start,pGVar5);
      if (__GLXEW_ATI_render_texture != '\0' || glewExperimental != '\0') {
        __glewXBindTexImageATI =
             (PFNGLXBINDTEXIMAGEATIPROC)glXGetProcAddressARB("glXBindTexImageATI");
        bVar64 = __glewXBindTexImageATI != (PFNGLXBINDTEXIMAGEATIPROC)0x0;
        __glewXDrawableAttribATI =
             (PFNGLXDRAWABLEATTRIBATIPROC)glXGetProcAddressARB("glXDrawableAttribATI");
        bVar65 = __glewXDrawableAttribATI != (PFNGLXDRAWABLEATTRIBATIPROC)0x0;
        __glewXReleaseTexImageATI =
             (PFNGLXRELEASETEXIMAGEATIPROC)glXGetProcAddressARB("glXReleaseTexImageATI");
        __GLXEW_ATI_render_texture =
             (__glewXReleaseTexImageATI != (PFNGLXRELEASETEXIMAGEATIPROC)0x0 && bVar65) && bVar64;
      }
      __GLXEW_EXT_buffer_age = _glewSearchExtension("GLX_EXT_buffer_age",start,pGVar5);
      __GLXEW_EXT_create_context_es2_profile =
           _glewSearchExtension("GLX_EXT_create_context_es2_profile",start,pGVar5);
      __GLXEW_EXT_create_context_es_profile =
           _glewSearchExtension("GLX_EXT_create_context_es_profile",start,pGVar5);
      __GLXEW_EXT_fbconfig_packed_float =
           _glewSearchExtension("GLX_EXT_fbconfig_packed_float",start,pGVar5);
      __GLXEW_EXT_framebuffer_sRGB = _glewSearchExtension("GLX_EXT_framebuffer_sRGB",start,pGVar5);
      __GLXEW_EXT_import_context = _glewSearchExtension("GLX_EXT_import_context",start,pGVar5);
      if (__GLXEW_EXT_import_context != '\0' || glewExperimental != '\0') {
        p_Var28 = (PFNGLXFREECONTEXTEXTPROC)glXGetProcAddressARB("glXFreeContextEXT");
        __glewXFreeContextEXT = p_Var28;
        p_Var29 = (PFNGLXGETCONTEXTIDEXTPROC)glXGetProcAddressARB("glXGetContextIDEXT");
        __glewXGetContextIDEXT = p_Var29;
        p_Var30 = (PFNGLXIMPORTCONTEXTEXTPROC)glXGetProcAddressARB("glXImportContextEXT");
        __glewXImportContextEXT = p_Var30;
        __glewXQueryContextInfoEXT =
             (PFNGLXQUERYCONTEXTINFOEXTPROC)glXGetProcAddressARB("glXQueryContextInfoEXT");
        auVar70._0_4_ =
             -(uint)((int)((ulong)__glewXQueryContextInfoEXT >> 0x20) == 0 &&
                    (int)__glewXQueryContextInfoEXT == 0);
        auVar70._4_4_ = -(uint)((int)p_Var30 == 0 && (int)((ulong)p_Var30 >> 0x20) == 0);
        auVar70._8_4_ = -(uint)((int)((ulong)p_Var29 >> 0x20) == 0 && (int)p_Var29 == 0);
        auVar70._12_4_ = -(uint)((int)p_Var28 == 0 && (int)((ulong)p_Var28 >> 0x20) == 0);
        iVar2 = movmskps((int)__glewXQueryContextInfoEXT,auVar70);
        __GLXEW_EXT_import_context = iVar2 == 0;
      }
      __GLXEW_EXT_libglvnd = _glewSearchExtension("GLX_EXT_libglvnd",start,pGVar5);
      __GLXEW_EXT_scene_marker = _glewSearchExtension("GLX_EXT_scene_marker",start,pGVar5);
      __GLXEW_EXT_stereo_tree = _glewSearchExtension("GLX_EXT_stereo_tree",start,pGVar5);
      __GLXEW_EXT_swap_control = _glewSearchExtension("GLX_EXT_swap_control",start,pGVar5);
      if (__GLXEW_EXT_swap_control != '\0' || glewExperimental != '\0') {
        __glewXSwapIntervalEXT =
             (PFNGLXSWAPINTERVALEXTPROC)glXGetProcAddressARB("glXSwapIntervalEXT");
        __GLXEW_EXT_swap_control = __glewXSwapIntervalEXT != (PFNGLXSWAPINTERVALEXTPROC)0x0;
      }
      __GLXEW_EXT_swap_control_tear = _glewSearchExtension("GLX_EXT_swap_control_tear",start,pGVar5)
      ;
      __GLXEW_EXT_texture_from_pixmap =
           _glewSearchExtension("GLX_EXT_texture_from_pixmap",start,pGVar5);
      if (__GLXEW_EXT_texture_from_pixmap != '\0' || glewExperimental != '\0') {
        __glewXBindTexImageEXT =
             (PFNGLXBINDTEXIMAGEEXTPROC)glXGetProcAddressARB("glXBindTexImageEXT");
        bVar64 = __glewXBindTexImageEXT != (PFNGLXBINDTEXIMAGEEXTPROC)0x0;
        __glewXReleaseTexImageEXT =
             (PFNGLXRELEASETEXIMAGEEXTPROC)glXGetProcAddressARB("glXReleaseTexImageEXT");
        __GLXEW_EXT_texture_from_pixmap =
             __glewXReleaseTexImageEXT != (PFNGLXRELEASETEXIMAGEEXTPROC)0x0 && bVar64;
      }
      __GLXEW_EXT_visual_info = _glewSearchExtension("GLX_EXT_visual_info",start,pGVar5);
      __GLXEW_EXT_visual_rating = _glewSearchExtension("GLX_EXT_visual_rating",start,pGVar5);
      __GLXEW_INTEL_swap_event = _glewSearchExtension("GLX_INTEL_swap_event",start,pGVar5);
      __GLXEW_MESA_agp_offset = _glewSearchExtension("GLX_MESA_agp_offset",start,pGVar5);
      if (__GLXEW_MESA_agp_offset != '\0' || glewExperimental != '\0') {
        __glewXGetAGPOffsetMESA =
             (PFNGLXGETAGPOFFSETMESAPROC)glXGetProcAddressARB("glXGetAGPOffsetMESA");
        __GLXEW_MESA_agp_offset = __glewXGetAGPOffsetMESA != (PFNGLXGETAGPOFFSETMESAPROC)0x0;
      }
      __GLXEW_MESA_copy_sub_buffer = _glewSearchExtension("GLX_MESA_copy_sub_buffer",start,pGVar5);
      if (__GLXEW_MESA_copy_sub_buffer != '\0' || glewExperimental != '\0') {
        __glewXCopySubBufferMESA =
             (PFNGLXCOPYSUBBUFFERMESAPROC)glXGetProcAddressARB("glXCopySubBufferMESA");
        __GLXEW_MESA_copy_sub_buffer = __glewXCopySubBufferMESA != (PFNGLXCOPYSUBBUFFERMESAPROC)0x0;
      }
      __GLXEW_MESA_pixmap_colormap = _glewSearchExtension("GLX_MESA_pixmap_colormap",start,pGVar5);
      if (__GLXEW_MESA_pixmap_colormap != '\0' || glewExperimental != '\0') {
        __glewXCreateGLXPixmapMESA =
             (PFNGLXCREATEGLXPIXMAPMESAPROC)glXGetProcAddressARB("glXCreateGLXPixmapMESA");
        __GLXEW_MESA_pixmap_colormap =
             __glewXCreateGLXPixmapMESA != (PFNGLXCREATEGLXPIXMAPMESAPROC)0x0;
      }
      __GLXEW_MESA_query_renderer = _glewSearchExtension("GLX_MESA_query_renderer",start,pGVar5);
      if (__GLXEW_MESA_query_renderer != '\0' || glewExperimental != '\0') {
        p_Var31 = (PFNGLXQUERYCURRENTRENDERERINTEGERMESAPROC)
                  glXGetProcAddressARB("glXQueryCurrentRendererIntegerMESA");
        __glewXQueryCurrentRendererIntegerMESA = p_Var31;
        p_Var32 = (PFNGLXQUERYCURRENTRENDERERSTRINGMESAPROC)
                  glXGetProcAddressARB("glXQueryCurrentRendererStringMESA");
        __glewXQueryCurrentRendererStringMESA = p_Var32;
        p_Var33 = (PFNGLXQUERYRENDERERINTEGERMESAPROC)
                  glXGetProcAddressARB("glXQueryRendererIntegerMESA");
        __glewXQueryRendererIntegerMESA = p_Var33;
        __glewXQueryRendererStringMESA =
             (PFNGLXQUERYRENDERERSTRINGMESAPROC)glXGetProcAddressARB("glXQueryRendererStringMESA");
        auVar71._0_4_ =
             -(uint)((int)((ulong)__glewXQueryRendererStringMESA >> 0x20) == 0 &&
                    (int)__glewXQueryRendererStringMESA == 0);
        auVar71._4_4_ = -(uint)((int)p_Var33 == 0 && (int)((ulong)p_Var33 >> 0x20) == 0);
        auVar71._8_4_ = -(uint)((int)((ulong)p_Var32 >> 0x20) == 0 && (int)p_Var32 == 0);
        auVar71._12_4_ = -(uint)((int)p_Var31 == 0 && (int)((ulong)p_Var31 >> 0x20) == 0);
        iVar2 = movmskps((int)__glewXQueryRendererStringMESA,auVar71);
        __GLXEW_MESA_query_renderer = iVar2 == 0;
      }
      __GLXEW_MESA_release_buffers = _glewSearchExtension("GLX_MESA_release_buffers",start,pGVar5);
      if (__GLXEW_MESA_release_buffers != '\0' || glewExperimental != '\0') {
        __glewXReleaseBuffersMESA =
             (PFNGLXRELEASEBUFFERSMESAPROC)glXGetProcAddressARB("glXReleaseBuffersMESA");
        __GLXEW_MESA_release_buffers =
             __glewXReleaseBuffersMESA != (PFNGLXRELEASEBUFFERSMESAPROC)0x0;
      }
      __GLXEW_MESA_set_3dfx_mode = _glewSearchExtension("GLX_MESA_set_3dfx_mode",start,pGVar5);
      if (__GLXEW_MESA_set_3dfx_mode != '\0' || glewExperimental != '\0') {
        __glewXSet3DfxModeMESA =
             (PFNGLXSET3DFXMODEMESAPROC)glXGetProcAddressARB("glXSet3DfxModeMESA");
        __GLXEW_MESA_set_3dfx_mode = __glewXSet3DfxModeMESA != (PFNGLXSET3DFXMODEMESAPROC)0x0;
      }
      __GLXEW_MESA_swap_control = _glewSearchExtension("GLX_MESA_swap_control",start,pGVar5);
      if (__GLXEW_MESA_swap_control != '\0' || glewExperimental != '\0') {
        __glewXGetSwapIntervalMESA =
             (PFNGLXGETSWAPINTERVALMESAPROC)glXGetProcAddressARB("glXGetSwapIntervalMESA");
        bVar64 = __glewXGetSwapIntervalMESA != (PFNGLXGETSWAPINTERVALMESAPROC)0x0;
        __glewXSwapIntervalMESA =
             (PFNGLXSWAPINTERVALMESAPROC)glXGetProcAddressARB("glXSwapIntervalMESA");
        __GLXEW_MESA_swap_control =
             __glewXSwapIntervalMESA != (PFNGLXSWAPINTERVALMESAPROC)0x0 && bVar64;
      }
      __GLXEW_NV_copy_buffer = _glewSearchExtension("GLX_NV_copy_buffer",start,pGVar5);
      if (__GLXEW_NV_copy_buffer != '\0' || glewExperimental != '\0') {
        __glewXCopyBufferSubDataNV =
             (PFNGLXCOPYBUFFERSUBDATANVPROC)glXGetProcAddressARB("glXCopyBufferSubDataNV");
        bVar64 = __glewXCopyBufferSubDataNV != (PFNGLXCOPYBUFFERSUBDATANVPROC)0x0;
        __glewXNamedCopyBufferSubDataNV =
             (PFNGLXNAMEDCOPYBUFFERSUBDATANVPROC)glXGetProcAddressARB("glXNamedCopyBufferSubDataNV")
        ;
        __GLXEW_NV_copy_buffer =
             __glewXNamedCopyBufferSubDataNV != (PFNGLXNAMEDCOPYBUFFERSUBDATANVPROC)0x0 && bVar64;
      }
      __GLXEW_NV_copy_image = _glewSearchExtension("GLX_NV_copy_image",start,pGVar5);
      if (__GLXEW_NV_copy_image != '\0' || glewExperimental != '\0') {
        __glewXCopyImageSubDataNV =
             (PFNGLXCOPYIMAGESUBDATANVPROC)glXGetProcAddressARB("glXCopyImageSubDataNV");
        __GLXEW_NV_copy_image = __glewXCopyImageSubDataNV != (PFNGLXCOPYIMAGESUBDATANVPROC)0x0;
      }
      __GLXEW_NV_delay_before_swap = _glewSearchExtension("GLX_NV_delay_before_swap",start,pGVar5);
      if (__GLXEW_NV_delay_before_swap != '\0' || glewExperimental != '\0') {
        __glewXDelayBeforeSwapNV =
             (PFNGLXDELAYBEFORESWAPNVPROC)glXGetProcAddressARB("glXDelayBeforeSwapNV");
        __GLXEW_NV_delay_before_swap = __glewXDelayBeforeSwapNV != (PFNGLXDELAYBEFORESWAPNVPROC)0x0;
      }
      __GLXEW_NV_float_buffer = _glewSearchExtension("GLX_NV_float_buffer",start,pGVar5);
      __GLXEW_NV_multisample_coverage =
           _glewSearchExtension("GLX_NV_multisample_coverage",start,pGVar5);
      __GLXEW_NV_present_video = _glewSearchExtension("GLX_NV_present_video",start,pGVar5);
      if (__GLXEW_NV_present_video != '\0' || glewExperimental != '\0') {
        __glewXBindVideoDeviceNV =
             (PFNGLXBINDVIDEODEVICENVPROC)glXGetProcAddressARB("glXBindVideoDeviceNV");
        bVar64 = __glewXBindVideoDeviceNV != (PFNGLXBINDVIDEODEVICENVPROC)0x0;
        __glewXEnumerateVideoDevicesNV =
             (PFNGLXENUMERATEVIDEODEVICESNVPROC)glXGetProcAddressARB("glXEnumerateVideoDevicesNV");
        __GLXEW_NV_present_video =
             __glewXEnumerateVideoDevicesNV != (PFNGLXENUMERATEVIDEODEVICESNVPROC)0x0 && bVar64;
      }
      __GLXEW_NV_robustness_video_memory_purge =
           _glewSearchExtension("GLX_NV_robustness_video_memory_purge",start,pGVar5);
      __GLXEW_NV_swap_group = _glewSearchExtension("GLX_NV_swap_group",start,pGVar5);
      if (__GLXEW_NV_swap_group != '\0' || glewExperimental != '\0') {
        __glewXBindSwapBarrierNV =
             (PFNGLXBINDSWAPBARRIERNVPROC)glXGetProcAddressARB("glXBindSwapBarrierNV");
        bVar64 = __glewXBindSwapBarrierNV != (PFNGLXBINDSWAPBARRIERNVPROC)0x0;
        __glewXJoinSwapGroupNV =
             (PFNGLXJOINSWAPGROUPNVPROC)glXGetProcAddressARB("glXJoinSwapGroupNV");
        bVar65 = __glewXJoinSwapGroupNV != (PFNGLXJOINSWAPGROUPNVPROC)0x0;
        p_Var34 = (PFNGLXQUERYFRAMECOUNTNVPROC)glXGetProcAddressARB("glXQueryFrameCountNV");
        __glewXQueryFrameCountNV = p_Var34;
        p_Var35 = (PFNGLXQUERYMAXSWAPGROUPSNVPROC)glXGetProcAddressARB("glXQueryMaxSwapGroupsNV");
        __glewXQueryMaxSwapGroupsNV = p_Var35;
        p_Var36 = (PFNGLXQUERYSWAPGROUPNVPROC)glXGetProcAddressARB("glXQuerySwapGroupNV");
        __glewXQuerySwapGroupNV = p_Var36;
        __glewXResetFrameCountNV =
             (PFNGLXRESETFRAMECOUNTNVPROC)glXGetProcAddressARB("glXResetFrameCountNV");
        auVar72._0_4_ =
             -(uint)((int)((ulong)__glewXResetFrameCountNV >> 0x20) == 0 &&
                    (int)__glewXResetFrameCountNV == 0);
        auVar72._4_4_ = -(uint)((int)p_Var36 == 0 && (int)((ulong)p_Var36 >> 0x20) == 0);
        auVar72._8_4_ = -(uint)((int)((ulong)p_Var35 >> 0x20) == 0 && (int)p_Var35 == 0);
        auVar72._12_4_ = -(uint)((int)p_Var34 == 0 && (int)((ulong)p_Var34 >> 0x20) == 0);
        iVar2 = movmskps((int)__glewXResetFrameCountNV,auVar72);
        __GLXEW_NV_swap_group = (bVar65 && bVar64) && iVar2 == 0;
      }
      __GLXEW_NV_vertex_array_range = _glewSearchExtension("GLX_NV_vertex_array_range",start,pGVar5)
      ;
      if (__GLXEW_NV_vertex_array_range != '\0' || glewExperimental != '\0') {
        __glewXAllocateMemoryNV =
             (PFNGLXALLOCATEMEMORYNVPROC)glXGetProcAddressARB("glXAllocateMemoryNV");
        bVar64 = __glewXAllocateMemoryNV != (PFNGLXALLOCATEMEMORYNVPROC)0x0;
        __glewXFreeMemoryNV = (PFNGLXFREEMEMORYNVPROC)glXGetProcAddressARB("glXFreeMemoryNV");
        __GLXEW_NV_vertex_array_range = __glewXFreeMemoryNV != (PFNGLXFREEMEMORYNVPROC)0x0 && bVar64
        ;
      }
      __GLXEW_NV_video_capture = _glewSearchExtension("GLX_NV_video_capture",start,pGVar5);
      if (__GLXEW_NV_video_capture != '\0' || glewExperimental != '\0') {
        __glewXBindVideoCaptureDeviceNV =
             (PFNGLXBINDVIDEOCAPTUREDEVICENVPROC)glXGetProcAddressARB("glXBindVideoCaptureDeviceNV")
        ;
        bVar64 = __glewXBindVideoCaptureDeviceNV != (PFNGLXBINDVIDEOCAPTUREDEVICENVPROC)0x0;
        p_Var37 = (PFNGLXENUMERATEVIDEOCAPTUREDEVICESNVPROC)
                  glXGetProcAddressARB("glXEnumerateVideoCaptureDevicesNV");
        __glewXEnumerateVideoCaptureDevicesNV = p_Var37;
        p_Var38 = (PFNGLXLOCKVIDEOCAPTUREDEVICENVPROC)
                  glXGetProcAddressARB("glXLockVideoCaptureDeviceNV");
        __glewXLockVideoCaptureDeviceNV = p_Var38;
        p_Var39 = (PFNGLXQUERYVIDEOCAPTUREDEVICENVPROC)
                  glXGetProcAddressARB("glXQueryVideoCaptureDeviceNV");
        __glewXQueryVideoCaptureDeviceNV = p_Var39;
        __glewXReleaseVideoCaptureDeviceNV =
             (PFNGLXRELEASEVIDEOCAPTUREDEVICENVPROC)
             glXGetProcAddressARB("glXReleaseVideoCaptureDeviceNV");
        auVar73._0_4_ =
             -(uint)((int)((ulong)__glewXReleaseVideoCaptureDeviceNV >> 0x20) == 0 &&
                    (int)__glewXReleaseVideoCaptureDeviceNV == 0);
        auVar73._4_4_ = -(uint)((int)p_Var39 == 0 && (int)((ulong)p_Var39 >> 0x20) == 0);
        auVar73._8_4_ = -(uint)((int)((ulong)p_Var38 >> 0x20) == 0 && (int)p_Var38 == 0);
        auVar73._12_4_ = -(uint)((int)p_Var37 == 0 && (int)((ulong)p_Var37 >> 0x20) == 0);
        iVar2 = movmskps((int)__glewXReleaseVideoCaptureDeviceNV,auVar73);
        __GLXEW_NV_video_capture = iVar2 == 0 && bVar64;
      }
      __GLXEW_NV_video_out = _glewSearchExtension("GLX_NV_video_out",start,pGVar5);
      if (__GLXEW_NV_video_out != '\0' || glewExperimental != '\0') {
        __glewXBindVideoImageNV =
             (PFNGLXBINDVIDEOIMAGENVPROC)glXGetProcAddressARB("glXBindVideoImageNV");
        bVar64 = __glewXBindVideoImageNV != (PFNGLXBINDVIDEOIMAGENVPROC)0x0;
        __glewXGetVideoDeviceNV =
             (PFNGLXGETVIDEODEVICENVPROC)glXGetProcAddressARB("glXGetVideoDeviceNV");
        bVar65 = __glewXGetVideoDeviceNV != (PFNGLXGETVIDEODEVICENVPROC)0x0;
        p_Var40 = (PFNGLXGETVIDEOINFONVPROC)glXGetProcAddressARB("glXGetVideoInfoNV");
        __glewXGetVideoInfoNV = p_Var40;
        p_Var41 = (PFNGLXRELEASEVIDEODEVICENVPROC)glXGetProcAddressARB("glXReleaseVideoDeviceNV");
        __glewXReleaseVideoDeviceNV = p_Var41;
        p_Var42 = (PFNGLXRELEASEVIDEOIMAGENVPROC)glXGetProcAddressARB("glXReleaseVideoImageNV");
        __glewXReleaseVideoImageNV = p_Var42;
        __glewXSendPbufferToVideoNV =
             (PFNGLXSENDPBUFFERTOVIDEONVPROC)glXGetProcAddressARB("glXSendPbufferToVideoNV");
        auVar74._0_4_ =
             -(uint)((int)((ulong)__glewXSendPbufferToVideoNV >> 0x20) == 0 &&
                    (int)__glewXSendPbufferToVideoNV == 0);
        auVar74._4_4_ = -(uint)((int)p_Var42 == 0 && (int)((ulong)p_Var42 >> 0x20) == 0);
        auVar74._8_4_ = -(uint)((int)((ulong)p_Var41 >> 0x20) == 0 && (int)p_Var41 == 0);
        auVar74._12_4_ = -(uint)((int)p_Var40 == 0 && (int)((ulong)p_Var40 >> 0x20) == 0);
        iVar2 = movmskps((int)__glewXSendPbufferToVideoNV,auVar74);
        __GLXEW_NV_video_out = (bVar65 && bVar64) && iVar2 == 0;
      }
      __GLXEW_OML_swap_method = _glewSearchExtension("GLX_OML_swap_method",start,pGVar5);
      __GLXEW_OML_sync_control = _glewSearchExtension("GLX_OML_sync_control",start,pGVar5);
      if (__GLXEW_OML_sync_control != '\0' || glewExperimental != '\0') {
        __glewXGetMscRateOML = (PFNGLXGETMSCRATEOMLPROC)glXGetProcAddressARB("glXGetMscRateOML");
        bVar64 = __glewXGetMscRateOML != (PFNGLXGETMSCRATEOMLPROC)0x0;
        p_Var43 = (PFNGLXGETSYNCVALUESOMLPROC)glXGetProcAddressARB("glXGetSyncValuesOML");
        __glewXGetSyncValuesOML = p_Var43;
        p_Var44 = (PFNGLXSWAPBUFFERSMSCOMLPROC)glXGetProcAddressARB("glXSwapBuffersMscOML");
        __glewXSwapBuffersMscOML = p_Var44;
        p_Var45 = (PFNGLXWAITFORMSCOMLPROC)glXGetProcAddressARB("glXWaitForMscOML");
        __glewXWaitForMscOML = p_Var45;
        __glewXWaitForSbcOML = (PFNGLXWAITFORSBCOMLPROC)glXGetProcAddressARB("glXWaitForSbcOML");
        auVar75._0_4_ =
             -(uint)((int)((ulong)__glewXWaitForSbcOML >> 0x20) == 0 &&
                    (int)__glewXWaitForSbcOML == 0);
        auVar75._4_4_ = -(uint)((int)p_Var45 == 0 && (int)((ulong)p_Var45 >> 0x20) == 0);
        auVar75._8_4_ = -(uint)((int)((ulong)p_Var44 >> 0x20) == 0 && (int)p_Var44 == 0);
        auVar75._12_4_ = -(uint)((int)p_Var43 == 0 && (int)((ulong)p_Var43 >> 0x20) == 0);
        iVar2 = movmskps((int)__glewXWaitForSbcOML,auVar75);
        __GLXEW_OML_sync_control = iVar2 == 0 && bVar64;
      }
      __GLXEW_SGIS_blended_overlay = _glewSearchExtension("GLX_SGIS_blended_overlay",start,pGVar5);
      __GLXEW_SGIS_color_range = _glewSearchExtension("GLX_SGIS_color_range",start,pGVar5);
      __GLXEW_SGIS_multisample = _glewSearchExtension("GLX_SGIS_multisample",start,pGVar5);
      __GLXEW_SGIS_shared_multisample =
           _glewSearchExtension("GLX_SGIS_shared_multisample",start,pGVar5);
      __GLXEW_SGIX_fbconfig = _glewSearchExtension("GLX_SGIX_fbconfig",start,pGVar5);
      if (__GLXEW_SGIX_fbconfig != '\0' || glewExperimental != '\0') {
        __glewXChooseFBConfigSGIX =
             (PFNGLXCHOOSEFBCONFIGSGIXPROC)glXGetProcAddressARB("glXChooseFBConfigSGIX");
        bVar64 = __glewXChooseFBConfigSGIX != (PFNGLXCHOOSEFBCONFIGSGIXPROC)0x0;
        __glewXCreateContextWithConfigSGIX =
             (PFNGLXCREATECONTEXTWITHCONFIGSGIXPROC)
             glXGetProcAddressARB("glXCreateContextWithConfigSGIX");
        bVar65 = __glewXCreateContextWithConfigSGIX != (PFNGLXCREATECONTEXTWITHCONFIGSGIXPROC)0x0;
        p_Var46 = (PFNGLXCREATEGLXPIXMAPWITHCONFIGSGIXPROC)
                  glXGetProcAddressARB("glXCreateGLXPixmapWithConfigSGIX");
        __glewXCreateGLXPixmapWithConfigSGIX = p_Var46;
        p_Var47 = (PFNGLXGETFBCONFIGATTRIBSGIXPROC)glXGetProcAddressARB("glXGetFBConfigAttribSGIX");
        __glewXGetFBConfigAttribSGIX = p_Var47;
        p_Var48 = (PFNGLXGETFBCONFIGFROMVISUALSGIXPROC)
                  glXGetProcAddressARB("glXGetFBConfigFromVisualSGIX");
        __glewXGetFBConfigFromVisualSGIX = p_Var48;
        __glewXGetVisualFromFBConfigSGIX =
             (PFNGLXGETVISUALFROMFBCONFIGSGIXPROC)
             glXGetProcAddressARB("glXGetVisualFromFBConfigSGIX");
        auVar76._0_4_ =
             -(uint)((int)((ulong)__glewXGetVisualFromFBConfigSGIX >> 0x20) == 0 &&
                    (int)__glewXGetVisualFromFBConfigSGIX == 0);
        auVar76._4_4_ = -(uint)((int)p_Var48 == 0 && (int)((ulong)p_Var48 >> 0x20) == 0);
        auVar76._8_4_ = -(uint)((int)((ulong)p_Var47 >> 0x20) == 0 && (int)p_Var47 == 0);
        auVar76._12_4_ = -(uint)((int)p_Var46 == 0 && (int)((ulong)p_Var46 >> 0x20) == 0);
        iVar2 = movmskps((int)__glewXGetVisualFromFBConfigSGIX,auVar76);
        __GLXEW_SGIX_fbconfig = (bVar65 && bVar64) && iVar2 == 0;
      }
      __GLXEW_SGIX_hyperpipe = _glewSearchExtension("GLX_SGIX_hyperpipe",start,pGVar5);
      if (__GLXEW_SGIX_hyperpipe != '\0' || glewExperimental != '\0') {
        p_Var49 = (PFNGLXBINDHYPERPIPESGIXPROC)glXGetProcAddressARB("glXBindHyperpipeSGIX");
        __glewXBindHyperpipeSGIX = p_Var49;
        p_Var50 = (PFNGLXDESTROYHYPERPIPECONFIGSGIXPROC)
                  glXGetProcAddressARB("glXDestroyHyperpipeConfigSGIX");
        __glewXDestroyHyperpipeConfigSGIX = p_Var50;
        p_Var51 = (PFNGLXHYPERPIPEATTRIBSGIXPROC)glXGetProcAddressARB("glXHyperpipeAttribSGIX");
        __glewXHyperpipeAttribSGIX = p_Var51;
        p_Var52 = (PFNGLXHYPERPIPECONFIGSGIXPROC)glXGetProcAddressARB("glXHyperpipeConfigSGIX");
        __glewXHyperpipeConfigSGIX = p_Var52;
        p_Var53 = (PFNGLXQUERYHYPERPIPEATTRIBSGIXPROC)
                  glXGetProcAddressARB("glXQueryHyperpipeAttribSGIX");
        __glewXQueryHyperpipeAttribSGIX = p_Var53;
        p_Var54 = (PFNGLXQUERYHYPERPIPEBESTATTRIBSGIXPROC)
                  glXGetProcAddressARB("glXQueryHyperpipeBestAttribSGIX");
        __glewXQueryHyperpipeBestAttribSGIX = p_Var54;
        p_Var55 = (PFNGLXQUERYHYPERPIPECONFIGSGIXPROC)
                  glXGetProcAddressARB("glXQueryHyperpipeConfigSGIX");
        __glewXQueryHyperpipeConfigSGIX = p_Var55;
        __glewXQueryHyperpipeNetworkSGIX =
             (PFNGLXQUERYHYPERPIPENETWORKSGIXPROC)
             glXGetProcAddressARB("glXQueryHyperpipeNetworkSGIX");
        auVar92._0_4_ = -(uint)((int)p_Var50 == 0);
        auVar92._4_4_ = -(uint)((int)((ulong)p_Var50 >> 0x20) == 0);
        auVar92._8_4_ = -(uint)((int)p_Var49 == 0);
        auVar92._12_4_ = -(uint)((int)((ulong)p_Var49 >> 0x20) == 0);
        auVar96._4_4_ = auVar92._0_4_;
        auVar96._0_4_ = auVar92._4_4_;
        auVar96._8_4_ = auVar92._12_4_;
        auVar96._12_4_ = auVar92._8_4_;
        auVar88._0_4_ = -(uint)((int)p_Var52 == 0);
        auVar88._4_4_ = -(uint)((int)((ulong)p_Var52 >> 0x20) == 0);
        auVar88._8_4_ = -(uint)((int)p_Var51 == 0);
        auVar88._12_4_ = -(uint)((int)((ulong)p_Var51 >> 0x20) == 0);
        auVar93._4_4_ = auVar88._0_4_;
        auVar93._0_4_ = auVar88._4_4_;
        auVar93._8_4_ = auVar88._12_4_;
        auVar93._12_4_ = auVar88._8_4_;
        auVar103 = packssdw(auVar93 & auVar88,auVar96 & auVar92);
        auVar82._0_4_ = -(uint)((int)p_Var54 == 0);
        auVar82._4_4_ = -(uint)((int)((ulong)p_Var54 >> 0x20) == 0);
        auVar82._8_4_ = -(uint)((int)p_Var53 == 0);
        auVar82._12_4_ = -(uint)((int)((ulong)p_Var53 >> 0x20) == 0);
        auVar89._4_4_ = auVar82._0_4_;
        auVar89._0_4_ = auVar82._4_4_;
        auVar89._8_4_ = auVar82._12_4_;
        auVar89._12_4_ = auVar82._8_4_;
        auVar67._0_4_ = -(uint)((int)__glewXQueryHyperpipeNetworkSGIX == 0);
        auVar67._4_4_ = -(uint)((int)((ulong)__glewXQueryHyperpipeNetworkSGIX >> 0x20) == 0);
        auVar67._8_4_ = -(uint)((int)p_Var55 == 0);
        auVar67._12_4_ = -(uint)((int)((ulong)p_Var55 >> 0x20) == 0);
        auVar77._4_4_ = auVar67._0_4_;
        auVar77._0_4_ = auVar67._4_4_;
        auVar77._8_4_ = auVar67._12_4_;
        auVar77._12_4_ = auVar67._8_4_;
        auVar99 = packssdw(auVar77 & auVar67,auVar89 & auVar82);
        auVar99 = packssdw(auVar99,auVar103);
        __GLXEW_SGIX_hyperpipe =
             (((((((auVar99 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                  (auVar99 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar99 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar99 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar99 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar99 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar99 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             -1 < auVar99[0xf];
      }
      __GLXEW_SGIX_pbuffer = _glewSearchExtension("GLX_SGIX_pbuffer",start,pGVar5);
      if (__GLXEW_SGIX_pbuffer != '\0' || glewExperimental != '\0') {
        __glewXCreateGLXPbufferSGIX =
             (PFNGLXCREATEGLXPBUFFERSGIXPROC)glXGetProcAddressARB("glXCreateGLXPbufferSGIX");
        bVar64 = __glewXCreateGLXPbufferSGIX != (PFNGLXCREATEGLXPBUFFERSGIXPROC)0x0;
        p_Var56 = (PFNGLXDESTROYGLXPBUFFERSGIXPROC)glXGetProcAddressARB("glXDestroyGLXPbufferSGIX");
        __glewXDestroyGLXPbufferSGIX = p_Var56;
        p_Var57 = (PFNGLXGETSELECTEDEVENTSGIXPROC)glXGetProcAddressARB("glXGetSelectedEventSGIX");
        __glewXGetSelectedEventSGIX = p_Var57;
        p_Var58 = (PFNGLXQUERYGLXPBUFFERSGIXPROC)glXGetProcAddressARB("glXQueryGLXPbufferSGIX");
        __glewXQueryGLXPbufferSGIX = p_Var58;
        __glewXSelectEventSGIX =
             (PFNGLXSELECTEVENTSGIXPROC)glXGetProcAddressARB("glXSelectEventSGIX");
        auVar78._0_4_ =
             -(uint)((int)((ulong)__glewXSelectEventSGIX >> 0x20) == 0 &&
                    (int)__glewXSelectEventSGIX == 0);
        auVar78._4_4_ = -(uint)((int)p_Var58 == 0 && (int)((ulong)p_Var58 >> 0x20) == 0);
        auVar78._8_4_ = -(uint)((int)((ulong)p_Var57 >> 0x20) == 0 && (int)p_Var57 == 0);
        auVar78._12_4_ = -(uint)((int)p_Var56 == 0 && (int)((ulong)p_Var56 >> 0x20) == 0);
        iVar2 = movmskps((int)__glewXSelectEventSGIX,auVar78);
        __GLXEW_SGIX_pbuffer = iVar2 == 0 && bVar64;
      }
      __GLXEW_SGIX_swap_barrier = _glewSearchExtension("GLX_SGIX_swap_barrier",start,pGVar5);
      if (__GLXEW_SGIX_swap_barrier != '\0' || glewExperimental != '\0') {
        __glewXBindSwapBarrierSGIX =
             (PFNGLXBINDSWAPBARRIERSGIXPROC)glXGetProcAddressARB("glXBindSwapBarrierSGIX");
        bVar64 = __glewXBindSwapBarrierSGIX != (PFNGLXBINDSWAPBARRIERSGIXPROC)0x0;
        __glewXQueryMaxSwapBarriersSGIX =
             (PFNGLXQUERYMAXSWAPBARRIERSSGIXPROC)glXGetProcAddressARB("glXQueryMaxSwapBarriersSGIX")
        ;
        __GLXEW_SGIX_swap_barrier =
             __glewXQueryMaxSwapBarriersSGIX != (PFNGLXQUERYMAXSWAPBARRIERSSGIXPROC)0x0 && bVar64;
      }
      __GLXEW_SGIX_swap_group = _glewSearchExtension("GLX_SGIX_swap_group",start,pGVar5);
      if (__GLXEW_SGIX_swap_group != '\0' || glewExperimental != '\0') {
        __glewXJoinSwapGroupSGIX =
             (PFNGLXJOINSWAPGROUPSGIXPROC)glXGetProcAddressARB("glXJoinSwapGroupSGIX");
        __GLXEW_SGIX_swap_group = __glewXJoinSwapGroupSGIX != (PFNGLXJOINSWAPGROUPSGIXPROC)0x0;
      }
      __GLXEW_SGIX_video_resize = _glewSearchExtension("GLX_SGIX_video_resize",start,pGVar5);
      if (__GLXEW_SGIX_video_resize != '\0' || glewExperimental != '\0') {
        __glewXBindChannelToWindowSGIX =
             (PFNGLXBINDCHANNELTOWINDOWSGIXPROC)glXGetProcAddressARB("glXBindChannelToWindowSGIX");
        bVar64 = __glewXBindChannelToWindowSGIX != (PFNGLXBINDCHANNELTOWINDOWSGIXPROC)0x0;
        p_Var59 = (PFNGLXCHANNELRECTSGIXPROC)glXGetProcAddressARB("glXChannelRectSGIX");
        __glewXChannelRectSGIX = p_Var59;
        p_Var60 = (PFNGLXCHANNELRECTSYNCSGIXPROC)glXGetProcAddressARB("glXChannelRectSyncSGIX");
        __glewXChannelRectSyncSGIX = p_Var60;
        p_Var61 = (PFNGLXQUERYCHANNELDELTASSGIXPROC)
                  glXGetProcAddressARB("glXQueryChannelDeltasSGIX");
        __glewXQueryChannelDeltasSGIX = p_Var61;
        __glewXQueryChannelRectSGIX =
             (PFNGLXQUERYCHANNELRECTSGIXPROC)glXGetProcAddressARB("glXQueryChannelRectSGIX");
        auVar79._0_4_ =
             -(uint)((int)((ulong)__glewXQueryChannelRectSGIX >> 0x20) == 0 &&
                    (int)__glewXQueryChannelRectSGIX == 0);
        auVar79._4_4_ = -(uint)((int)p_Var61 == 0 && (int)((ulong)p_Var61 >> 0x20) == 0);
        auVar79._8_4_ = -(uint)((int)((ulong)p_Var60 >> 0x20) == 0 && (int)p_Var60 == 0);
        auVar79._12_4_ = -(uint)((int)p_Var59 == 0 && (int)((ulong)p_Var59 >> 0x20) == 0);
        iVar2 = movmskps((int)__glewXQueryChannelRectSGIX,auVar79);
        __GLXEW_SGIX_video_resize = iVar2 == 0 && bVar64;
      }
      __GLXEW_SGIX_visual_select_group =
           _glewSearchExtension("GLX_SGIX_visual_select_group",start,pGVar5);
      __GLXEW_SGI_cushion = _glewSearchExtension("GLX_SGI_cushion",start,pGVar5);
      if (__GLXEW_SGI_cushion != '\0' || glewExperimental != '\0') {
        __glewXCushionSGI = (PFNGLXCUSHIONSGIPROC)glXGetProcAddressARB("glXCushionSGI");
        __GLXEW_SGI_cushion = __glewXCushionSGI != (PFNGLXCUSHIONSGIPROC)0x0;
      }
      __GLXEW_SGI_make_current_read = _glewSearchExtension("GLX_SGI_make_current_read",start,pGVar5)
      ;
      if (__GLXEW_SGI_make_current_read != '\0' || glewExperimental != '\0') {
        __glewXGetCurrentReadDrawableSGI =
             (PFNGLXGETCURRENTREADDRAWABLESGIPROC)
             glXGetProcAddressARB("glXGetCurrentReadDrawableSGI");
        bVar64 = __glewXGetCurrentReadDrawableSGI != (PFNGLXGETCURRENTREADDRAWABLESGIPROC)0x0;
        __glewXMakeCurrentReadSGI =
             (PFNGLXMAKECURRENTREADSGIPROC)glXGetProcAddressARB("glXMakeCurrentReadSGI");
        __GLXEW_SGI_make_current_read =
             __glewXMakeCurrentReadSGI != (PFNGLXMAKECURRENTREADSGIPROC)0x0 && bVar64;
      }
      __GLXEW_SGI_swap_control = _glewSearchExtension("GLX_SGI_swap_control",start,pGVar5);
      if (__GLXEW_SGI_swap_control != '\0' || glewExperimental != '\0') {
        __glewXSwapIntervalSGI =
             (PFNGLXSWAPINTERVALSGIPROC)glXGetProcAddressARB("glXSwapIntervalSGI");
        __GLXEW_SGI_swap_control = __glewXSwapIntervalSGI != (PFNGLXSWAPINTERVALSGIPROC)0x0;
      }
      __GLXEW_SGI_video_sync = _glewSearchExtension("GLX_SGI_video_sync",start,pGVar5);
      if (__GLXEW_SGI_video_sync != '\0' || glewExperimental != '\0') {
        __glewXGetVideoSyncSGI =
             (PFNGLXGETVIDEOSYNCSGIPROC)glXGetProcAddressARB("glXGetVideoSyncSGI");
        bVar64 = __glewXGetVideoSyncSGI != (PFNGLXGETVIDEOSYNCSGIPROC)0x0;
        __glewXWaitVideoSyncSGI =
             (PFNGLXWAITVIDEOSYNCSGIPROC)glXGetProcAddressARB("glXWaitVideoSyncSGI");
        __GLXEW_SGI_video_sync =
             __glewXWaitVideoSyncSGI != (PFNGLXWAITVIDEOSYNCSGIPROC)0x0 && bVar64;
      }
      __GLXEW_SUN_get_transparent_index =
           _glewSearchExtension("GLX_SUN_get_transparent_index",start,pGVar5);
      if (__GLXEW_SUN_get_transparent_index != '\0' || glewExperimental != '\0') {
        __glewXGetTransparentIndexSUN =
             (PFNGLXGETTRANSPARENTINDEXSUNPROC)glXGetProcAddressARB("glXGetTransparentIndexSUN");
        __GLXEW_SUN_get_transparent_index =
             __glewXGetTransparentIndexSUN != (PFNGLXGETTRANSPARENTINDEXSUNPROC)0x0;
      }
      __GLXEW_SUN_video_resize = _glewSearchExtension("GLX_SUN_video_resize",start,pGVar5);
      GVar62 = 0;
      if (__GLXEW_SUN_video_resize != '\0' || glewExperimental != '\0') {
        __glewXGetVideoResizeSUN =
             (PFNGLXGETVIDEORESIZESUNPROC)glXGetProcAddressARB("glXGetVideoResizeSUN");
        bVar64 = __glewXGetVideoResizeSUN != (PFNGLXGETVIDEORESIZESUNPROC)0x0;
        __glewXVideoResizeSUN = (PFNGLXVIDEORESIZESUNPROC)glXGetProcAddressARB("glXVideoResizeSUN");
        __GLXEW_SUN_video_resize = __glewXVideoResizeSUN != (PFNGLXVIDEORESIZESUNPROC)0x0 && bVar64;
        GVar62 = 0;
      }
    }
  }
  return GVar62;
}

Assistant:

GLenum glxewInit ()
{
  Display* display;
  int major, minor;
  const GLubyte* extStart;
  const GLubyte* extEnd;
  /* initialize core GLX 1.2 */
  if (_glewInit_GLX_VERSION_1_2()) return GLEW_ERROR_GLX_VERSION_11_ONLY;
  /* check for a display */
  display = glXGetCurrentDisplay();
  if (display == NULL) return GLEW_ERROR_NO_GLX_DISPLAY;
  /* initialize flags */
  GLXEW_VERSION_1_0 = GL_TRUE;
  GLXEW_VERSION_1_1 = GL_TRUE;
  GLXEW_VERSION_1_2 = GL_TRUE;
  GLXEW_VERSION_1_3 = GL_TRUE;
  GLXEW_VERSION_1_4 = GL_TRUE;
  /* query GLX version */
  glXQueryVersion(display, &major, &minor);
  if (major == 1 && minor <= 3)
  {
    switch (minor)
    {
      case 3:
      GLXEW_VERSION_1_4 = GL_FALSE;
      break;
      case 2:
      GLXEW_VERSION_1_4 = GL_FALSE;
      GLXEW_VERSION_1_3 = GL_FALSE;
      break;
      default:
      return GLEW_ERROR_GLX_VERSION_11_ONLY;
      break;
    }
  }
  /* query GLX extension string */
  extStart = 0;
  if (glXGetCurrentDisplay != NULL)
    extStart = (const GLubyte*)glXGetClientString(display, GLX_EXTENSIONS);
  if (extStart == 0)
    extStart = (const GLubyte *)"";
  extEnd = extStart + _glewStrLen(extStart);
  /* initialize extensions */
#ifdef GLX_VERSION_1_3
  if (glewExperimental || GLXEW_VERSION_1_3) GLXEW_VERSION_1_3 = !_glewInit_GLX_VERSION_1_3();
#endif /* GLX_VERSION_1_3 */
#ifdef GLX_3DFX_multisample
  GLXEW_3DFX_multisample = _glewSearchExtension("GLX_3DFX_multisample", extStart, extEnd);
#endif /* GLX_3DFX_multisample */
#ifdef GLX_AMD_gpu_association
  GLXEW_AMD_gpu_association = _glewSearchExtension("GLX_AMD_gpu_association", extStart, extEnd);
  if (glewExperimental || GLXEW_AMD_gpu_association) GLXEW_AMD_gpu_association = !_glewInit_GLX_AMD_gpu_association();
#endif /* GLX_AMD_gpu_association */
#ifdef GLX_ARB_context_flush_control
  GLXEW_ARB_context_flush_control = _glewSearchExtension("GLX_ARB_context_flush_control", extStart, extEnd);
#endif /* GLX_ARB_context_flush_control */
#ifdef GLX_ARB_create_context
  GLXEW_ARB_create_context = _glewSearchExtension("GLX_ARB_create_context", extStart, extEnd);
  if (glewExperimental || GLXEW_ARB_create_context) GLXEW_ARB_create_context = !_glewInit_GLX_ARB_create_context();
#endif /* GLX_ARB_create_context */
#ifdef GLX_ARB_create_context_no_error
  GLXEW_ARB_create_context_no_error = _glewSearchExtension("GLX_ARB_create_context_no_error", extStart, extEnd);
#endif /* GLX_ARB_create_context_no_error */
#ifdef GLX_ARB_create_context_profile
  GLXEW_ARB_create_context_profile = _glewSearchExtension("GLX_ARB_create_context_profile", extStart, extEnd);
#endif /* GLX_ARB_create_context_profile */
#ifdef GLX_ARB_create_context_robustness
  GLXEW_ARB_create_context_robustness = _glewSearchExtension("GLX_ARB_create_context_robustness", extStart, extEnd);
#endif /* GLX_ARB_create_context_robustness */
#ifdef GLX_ARB_fbconfig_float
  GLXEW_ARB_fbconfig_float = _glewSearchExtension("GLX_ARB_fbconfig_float", extStart, extEnd);
#endif /* GLX_ARB_fbconfig_float */
#ifdef GLX_ARB_framebuffer_sRGB
  GLXEW_ARB_framebuffer_sRGB = _glewSearchExtension("GLX_ARB_framebuffer_sRGB", extStart, extEnd);
#endif /* GLX_ARB_framebuffer_sRGB */
#ifdef GLX_ARB_get_proc_address
  GLXEW_ARB_get_proc_address = _glewSearchExtension("GLX_ARB_get_proc_address", extStart, extEnd);
#endif /* GLX_ARB_get_proc_address */
#ifdef GLX_ARB_multisample
  GLXEW_ARB_multisample = _glewSearchExtension("GLX_ARB_multisample", extStart, extEnd);
#endif /* GLX_ARB_multisample */
#ifdef GLX_ARB_robustness_application_isolation
  GLXEW_ARB_robustness_application_isolation = _glewSearchExtension("GLX_ARB_robustness_application_isolation", extStart, extEnd);
#endif /* GLX_ARB_robustness_application_isolation */
#ifdef GLX_ARB_robustness_share_group_isolation
  GLXEW_ARB_robustness_share_group_isolation = _glewSearchExtension("GLX_ARB_robustness_share_group_isolation", extStart, extEnd);
#endif /* GLX_ARB_robustness_share_group_isolation */
#ifdef GLX_ARB_vertex_buffer_object
  GLXEW_ARB_vertex_buffer_object = _glewSearchExtension("GLX_ARB_vertex_buffer_object", extStart, extEnd);
#endif /* GLX_ARB_vertex_buffer_object */
#ifdef GLX_ATI_pixel_format_float
  GLXEW_ATI_pixel_format_float = _glewSearchExtension("GLX_ATI_pixel_format_float", extStart, extEnd);
#endif /* GLX_ATI_pixel_format_float */
#ifdef GLX_ATI_render_texture
  GLXEW_ATI_render_texture = _glewSearchExtension("GLX_ATI_render_texture", extStart, extEnd);
  if (glewExperimental || GLXEW_ATI_render_texture) GLXEW_ATI_render_texture = !_glewInit_GLX_ATI_render_texture();
#endif /* GLX_ATI_render_texture */
#ifdef GLX_EXT_buffer_age
  GLXEW_EXT_buffer_age = _glewSearchExtension("GLX_EXT_buffer_age", extStart, extEnd);
#endif /* GLX_EXT_buffer_age */
#ifdef GLX_EXT_create_context_es2_profile
  GLXEW_EXT_create_context_es2_profile = _glewSearchExtension("GLX_EXT_create_context_es2_profile", extStart, extEnd);
#endif /* GLX_EXT_create_context_es2_profile */
#ifdef GLX_EXT_create_context_es_profile
  GLXEW_EXT_create_context_es_profile = _glewSearchExtension("GLX_EXT_create_context_es_profile", extStart, extEnd);
#endif /* GLX_EXT_create_context_es_profile */
#ifdef GLX_EXT_fbconfig_packed_float
  GLXEW_EXT_fbconfig_packed_float = _glewSearchExtension("GLX_EXT_fbconfig_packed_float", extStart, extEnd);
#endif /* GLX_EXT_fbconfig_packed_float */
#ifdef GLX_EXT_framebuffer_sRGB
  GLXEW_EXT_framebuffer_sRGB = _glewSearchExtension("GLX_EXT_framebuffer_sRGB", extStart, extEnd);
#endif /* GLX_EXT_framebuffer_sRGB */
#ifdef GLX_EXT_import_context
  GLXEW_EXT_import_context = _glewSearchExtension("GLX_EXT_import_context", extStart, extEnd);
  if (glewExperimental || GLXEW_EXT_import_context) GLXEW_EXT_import_context = !_glewInit_GLX_EXT_import_context();
#endif /* GLX_EXT_import_context */
#ifdef GLX_EXT_libglvnd
  GLXEW_EXT_libglvnd = _glewSearchExtension("GLX_EXT_libglvnd", extStart, extEnd);
#endif /* GLX_EXT_libglvnd */
#ifdef GLX_EXT_scene_marker
  GLXEW_EXT_scene_marker = _glewSearchExtension("GLX_EXT_scene_marker", extStart, extEnd);
#endif /* GLX_EXT_scene_marker */
#ifdef GLX_EXT_stereo_tree
  GLXEW_EXT_stereo_tree = _glewSearchExtension("GLX_EXT_stereo_tree", extStart, extEnd);
#endif /* GLX_EXT_stereo_tree */
#ifdef GLX_EXT_swap_control
  GLXEW_EXT_swap_control = _glewSearchExtension("GLX_EXT_swap_control", extStart, extEnd);
  if (glewExperimental || GLXEW_EXT_swap_control) GLXEW_EXT_swap_control = !_glewInit_GLX_EXT_swap_control();
#endif /* GLX_EXT_swap_control */
#ifdef GLX_EXT_swap_control_tear
  GLXEW_EXT_swap_control_tear = _glewSearchExtension("GLX_EXT_swap_control_tear", extStart, extEnd);
#endif /* GLX_EXT_swap_control_tear */
#ifdef GLX_EXT_texture_from_pixmap
  GLXEW_EXT_texture_from_pixmap = _glewSearchExtension("GLX_EXT_texture_from_pixmap", extStart, extEnd);
  if (glewExperimental || GLXEW_EXT_texture_from_pixmap) GLXEW_EXT_texture_from_pixmap = !_glewInit_GLX_EXT_texture_from_pixmap();
#endif /* GLX_EXT_texture_from_pixmap */
#ifdef GLX_EXT_visual_info
  GLXEW_EXT_visual_info = _glewSearchExtension("GLX_EXT_visual_info", extStart, extEnd);
#endif /* GLX_EXT_visual_info */
#ifdef GLX_EXT_visual_rating
  GLXEW_EXT_visual_rating = _glewSearchExtension("GLX_EXT_visual_rating", extStart, extEnd);
#endif /* GLX_EXT_visual_rating */
#ifdef GLX_INTEL_swap_event
  GLXEW_INTEL_swap_event = _glewSearchExtension("GLX_INTEL_swap_event", extStart, extEnd);
#endif /* GLX_INTEL_swap_event */
#ifdef GLX_MESA_agp_offset
  GLXEW_MESA_agp_offset = _glewSearchExtension("GLX_MESA_agp_offset", extStart, extEnd);
  if (glewExperimental || GLXEW_MESA_agp_offset) GLXEW_MESA_agp_offset = !_glewInit_GLX_MESA_agp_offset();
#endif /* GLX_MESA_agp_offset */
#ifdef GLX_MESA_copy_sub_buffer
  GLXEW_MESA_copy_sub_buffer = _glewSearchExtension("GLX_MESA_copy_sub_buffer", extStart, extEnd);
  if (glewExperimental || GLXEW_MESA_copy_sub_buffer) GLXEW_MESA_copy_sub_buffer = !_glewInit_GLX_MESA_copy_sub_buffer();
#endif /* GLX_MESA_copy_sub_buffer */
#ifdef GLX_MESA_pixmap_colormap
  GLXEW_MESA_pixmap_colormap = _glewSearchExtension("GLX_MESA_pixmap_colormap", extStart, extEnd);
  if (glewExperimental || GLXEW_MESA_pixmap_colormap) GLXEW_MESA_pixmap_colormap = !_glewInit_GLX_MESA_pixmap_colormap();
#endif /* GLX_MESA_pixmap_colormap */
#ifdef GLX_MESA_query_renderer
  GLXEW_MESA_query_renderer = _glewSearchExtension("GLX_MESA_query_renderer", extStart, extEnd);
  if (glewExperimental || GLXEW_MESA_query_renderer) GLXEW_MESA_query_renderer = !_glewInit_GLX_MESA_query_renderer();
#endif /* GLX_MESA_query_renderer */
#ifdef GLX_MESA_release_buffers
  GLXEW_MESA_release_buffers = _glewSearchExtension("GLX_MESA_release_buffers", extStart, extEnd);
  if (glewExperimental || GLXEW_MESA_release_buffers) GLXEW_MESA_release_buffers = !_glewInit_GLX_MESA_release_buffers();
#endif /* GLX_MESA_release_buffers */
#ifdef GLX_MESA_set_3dfx_mode
  GLXEW_MESA_set_3dfx_mode = _glewSearchExtension("GLX_MESA_set_3dfx_mode", extStart, extEnd);
  if (glewExperimental || GLXEW_MESA_set_3dfx_mode) GLXEW_MESA_set_3dfx_mode = !_glewInit_GLX_MESA_set_3dfx_mode();
#endif /* GLX_MESA_set_3dfx_mode */
#ifdef GLX_MESA_swap_control
  GLXEW_MESA_swap_control = _glewSearchExtension("GLX_MESA_swap_control", extStart, extEnd);
  if (glewExperimental || GLXEW_MESA_swap_control) GLXEW_MESA_swap_control = !_glewInit_GLX_MESA_swap_control();
#endif /* GLX_MESA_swap_control */
#ifdef GLX_NV_copy_buffer
  GLXEW_NV_copy_buffer = _glewSearchExtension("GLX_NV_copy_buffer", extStart, extEnd);
  if (glewExperimental || GLXEW_NV_copy_buffer) GLXEW_NV_copy_buffer = !_glewInit_GLX_NV_copy_buffer();
#endif /* GLX_NV_copy_buffer */
#ifdef GLX_NV_copy_image
  GLXEW_NV_copy_image = _glewSearchExtension("GLX_NV_copy_image", extStart, extEnd);
  if (glewExperimental || GLXEW_NV_copy_image) GLXEW_NV_copy_image = !_glewInit_GLX_NV_copy_image();
#endif /* GLX_NV_copy_image */
#ifdef GLX_NV_delay_before_swap
  GLXEW_NV_delay_before_swap = _glewSearchExtension("GLX_NV_delay_before_swap", extStart, extEnd);
  if (glewExperimental || GLXEW_NV_delay_before_swap) GLXEW_NV_delay_before_swap = !_glewInit_GLX_NV_delay_before_swap();
#endif /* GLX_NV_delay_before_swap */
#ifdef GLX_NV_float_buffer
  GLXEW_NV_float_buffer = _glewSearchExtension("GLX_NV_float_buffer", extStart, extEnd);
#endif /* GLX_NV_float_buffer */
#ifdef GLX_NV_multisample_coverage
  GLXEW_NV_multisample_coverage = _glewSearchExtension("GLX_NV_multisample_coverage", extStart, extEnd);
#endif /* GLX_NV_multisample_coverage */
#ifdef GLX_NV_present_video
  GLXEW_NV_present_video = _glewSearchExtension("GLX_NV_present_video", extStart, extEnd);
  if (glewExperimental || GLXEW_NV_present_video) GLXEW_NV_present_video = !_glewInit_GLX_NV_present_video();
#endif /* GLX_NV_present_video */
#ifdef GLX_NV_robustness_video_memory_purge
  GLXEW_NV_robustness_video_memory_purge = _glewSearchExtension("GLX_NV_robustness_video_memory_purge", extStart, extEnd);
#endif /* GLX_NV_robustness_video_memory_purge */
#ifdef GLX_NV_swap_group
  GLXEW_NV_swap_group = _glewSearchExtension("GLX_NV_swap_group", extStart, extEnd);
  if (glewExperimental || GLXEW_NV_swap_group) GLXEW_NV_swap_group = !_glewInit_GLX_NV_swap_group();
#endif /* GLX_NV_swap_group */
#ifdef GLX_NV_vertex_array_range
  GLXEW_NV_vertex_array_range = _glewSearchExtension("GLX_NV_vertex_array_range", extStart, extEnd);
  if (glewExperimental || GLXEW_NV_vertex_array_range) GLXEW_NV_vertex_array_range = !_glewInit_GLX_NV_vertex_array_range();
#endif /* GLX_NV_vertex_array_range */
#ifdef GLX_NV_video_capture
  GLXEW_NV_video_capture = _glewSearchExtension("GLX_NV_video_capture", extStart, extEnd);
  if (glewExperimental || GLXEW_NV_video_capture) GLXEW_NV_video_capture = !_glewInit_GLX_NV_video_capture();
#endif /* GLX_NV_video_capture */
#ifdef GLX_NV_video_out
  GLXEW_NV_video_out = _glewSearchExtension("GLX_NV_video_out", extStart, extEnd);
  if (glewExperimental || GLXEW_NV_video_out) GLXEW_NV_video_out = !_glewInit_GLX_NV_video_out();
#endif /* GLX_NV_video_out */
#ifdef GLX_OML_swap_method
  GLXEW_OML_swap_method = _glewSearchExtension("GLX_OML_swap_method", extStart, extEnd);
#endif /* GLX_OML_swap_method */
#ifdef GLX_OML_sync_control
  GLXEW_OML_sync_control = _glewSearchExtension("GLX_OML_sync_control", extStart, extEnd);
  if (glewExperimental || GLXEW_OML_sync_control) GLXEW_OML_sync_control = !_glewInit_GLX_OML_sync_control();
#endif /* GLX_OML_sync_control */
#ifdef GLX_SGIS_blended_overlay
  GLXEW_SGIS_blended_overlay = _glewSearchExtension("GLX_SGIS_blended_overlay", extStart, extEnd);
#endif /* GLX_SGIS_blended_overlay */
#ifdef GLX_SGIS_color_range
  GLXEW_SGIS_color_range = _glewSearchExtension("GLX_SGIS_color_range", extStart, extEnd);
#endif /* GLX_SGIS_color_range */
#ifdef GLX_SGIS_multisample
  GLXEW_SGIS_multisample = _glewSearchExtension("GLX_SGIS_multisample", extStart, extEnd);
#endif /* GLX_SGIS_multisample */
#ifdef GLX_SGIS_shared_multisample
  GLXEW_SGIS_shared_multisample = _glewSearchExtension("GLX_SGIS_shared_multisample", extStart, extEnd);
#endif /* GLX_SGIS_shared_multisample */
#ifdef GLX_SGIX_fbconfig
  GLXEW_SGIX_fbconfig = _glewSearchExtension("GLX_SGIX_fbconfig", extStart, extEnd);
  if (glewExperimental || GLXEW_SGIX_fbconfig) GLXEW_SGIX_fbconfig = !_glewInit_GLX_SGIX_fbconfig();
#endif /* GLX_SGIX_fbconfig */
#ifdef GLX_SGIX_hyperpipe
  GLXEW_SGIX_hyperpipe = _glewSearchExtension("GLX_SGIX_hyperpipe", extStart, extEnd);
  if (glewExperimental || GLXEW_SGIX_hyperpipe) GLXEW_SGIX_hyperpipe = !_glewInit_GLX_SGIX_hyperpipe();
#endif /* GLX_SGIX_hyperpipe */
#ifdef GLX_SGIX_pbuffer
  GLXEW_SGIX_pbuffer = _glewSearchExtension("GLX_SGIX_pbuffer", extStart, extEnd);
  if (glewExperimental || GLXEW_SGIX_pbuffer) GLXEW_SGIX_pbuffer = !_glewInit_GLX_SGIX_pbuffer();
#endif /* GLX_SGIX_pbuffer */
#ifdef GLX_SGIX_swap_barrier
  GLXEW_SGIX_swap_barrier = _glewSearchExtension("GLX_SGIX_swap_barrier", extStart, extEnd);
  if (glewExperimental || GLXEW_SGIX_swap_barrier) GLXEW_SGIX_swap_barrier = !_glewInit_GLX_SGIX_swap_barrier();
#endif /* GLX_SGIX_swap_barrier */
#ifdef GLX_SGIX_swap_group
  GLXEW_SGIX_swap_group = _glewSearchExtension("GLX_SGIX_swap_group", extStart, extEnd);
  if (glewExperimental || GLXEW_SGIX_swap_group) GLXEW_SGIX_swap_group = !_glewInit_GLX_SGIX_swap_group();
#endif /* GLX_SGIX_swap_group */
#ifdef GLX_SGIX_video_resize
  GLXEW_SGIX_video_resize = _glewSearchExtension("GLX_SGIX_video_resize", extStart, extEnd);
  if (glewExperimental || GLXEW_SGIX_video_resize) GLXEW_SGIX_video_resize = !_glewInit_GLX_SGIX_video_resize();
#endif /* GLX_SGIX_video_resize */
#ifdef GLX_SGIX_visual_select_group
  GLXEW_SGIX_visual_select_group = _glewSearchExtension("GLX_SGIX_visual_select_group", extStart, extEnd);
#endif /* GLX_SGIX_visual_select_group */
#ifdef GLX_SGI_cushion
  GLXEW_SGI_cushion = _glewSearchExtension("GLX_SGI_cushion", extStart, extEnd);
  if (glewExperimental || GLXEW_SGI_cushion) GLXEW_SGI_cushion = !_glewInit_GLX_SGI_cushion();
#endif /* GLX_SGI_cushion */
#ifdef GLX_SGI_make_current_read
  GLXEW_SGI_make_current_read = _glewSearchExtension("GLX_SGI_make_current_read", extStart, extEnd);
  if (glewExperimental || GLXEW_SGI_make_current_read) GLXEW_SGI_make_current_read = !_glewInit_GLX_SGI_make_current_read();
#endif /* GLX_SGI_make_current_read */
#ifdef GLX_SGI_swap_control
  GLXEW_SGI_swap_control = _glewSearchExtension("GLX_SGI_swap_control", extStart, extEnd);
  if (glewExperimental || GLXEW_SGI_swap_control) GLXEW_SGI_swap_control = !_glewInit_GLX_SGI_swap_control();
#endif /* GLX_SGI_swap_control */
#ifdef GLX_SGI_video_sync
  GLXEW_SGI_video_sync = _glewSearchExtension("GLX_SGI_video_sync", extStart, extEnd);
  if (glewExperimental || GLXEW_SGI_video_sync) GLXEW_SGI_video_sync = !_glewInit_GLX_SGI_video_sync();
#endif /* GLX_SGI_video_sync */
#ifdef GLX_SUN_get_transparent_index
  GLXEW_SUN_get_transparent_index = _glewSearchExtension("GLX_SUN_get_transparent_index", extStart, extEnd);
  if (glewExperimental || GLXEW_SUN_get_transparent_index) GLXEW_SUN_get_transparent_index = !_glewInit_GLX_SUN_get_transparent_index();
#endif /* GLX_SUN_get_transparent_index */
#ifdef GLX_SUN_video_resize
  GLXEW_SUN_video_resize = _glewSearchExtension("GLX_SUN_video_resize", extStart, extEnd);
  if (glewExperimental || GLXEW_SUN_video_resize) GLXEW_SUN_video_resize = !_glewInit_GLX_SUN_video_resize();
#endif /* GLX_SUN_video_resize */

  return GLEW_OK;
}